

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

int xmlRaiseError(xmlStructuredErrorFunc schannel,xmlGenericErrorFunc channel,void *data,void *ctx,
                 xmlNode *node,int domain,int code,xmlErrorLevel level,char *file,int line,
                 char *str1,char *str2,char *str3,int int1,int col,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &stack0x00000058;
  local_108.gp_offset = 0x30;
  local_108.fp_offset = 0x30;
  iVar1 = xmlVRaiseError(schannel,channel,data,ctx,node,domain,code,level,file,line,str1,str2,str3,
                         int1,col,msg,&local_108);
  return iVar1;
}

Assistant:

int
xmlRaiseError(xmlStructuredErrorFunc schannel,
              xmlGenericErrorFunc channel, void *data, void *ctx,
              xmlNode *node, int domain, int code, xmlErrorLevel level,
              const char *file, int line, const char *str1,
              const char *str2, const char *str3, int int1, int col,
              const char *msg, ...)
{
    va_list ap;
    int res;

    va_start(ap, msg);
    res = xmlVRaiseError(schannel, channel, data, ctx, node, domain, code,
                         level, file, line, str1, str2, str3, int1, col, msg,
                         ap);
    va_end(ap);

    return(res);
}